

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Implicit_manifold_intersection_oracle.h
# Opt level: O3

VectorXd __thiscall
Gudhi::coxeter_triangulation::
Implicit_manifold_intersection_oracle<Gudhi::coxeter_triangulation::Function_torus_in_R3,Gudhi::coxeter_triangulation::Function_Sm_in_Rd>
::
compute_lambda<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>>
          (Implicit_manifold_intersection_oracle<Gudhi::coxeter_triangulation::Function_torus_in_R3,Gudhi::coxeter_triangulation::Function_Sm_in_Rd>
           *this,Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                 *simplex,
          Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
          *triangulation)

{
  double *pdVar1;
  bool bVar2;
  DenseStorage<double,__1,__1,_1,_0> *pDVar3;
  undefined8 *puVar4;
  Vertex_handle *in_RCX;
  bool bVar5;
  long lVar6;
  Index extraout_RDX;
  long lVar7;
  long lVar8;
  ActualDstType actualDst;
  VectorXd VVar9;
  MatrixXd matrix;
  Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  __begin0;
  VectorXd *lambda;
  vector<int,_std::allocator<int>_> v;
  Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  __end0;
  VectorXd v_coords;
  DenseStorage<double,__1,__1,__1,_0> local_198;
  Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  local_178;
  DenseStorage<double,__1,__1,_1,_0> *local_148;
  vector<int,_std::allocator<int>_> local_140;
  SrcXprType local_128;
  vector<int,_std::allocator<int>_> local_118;
  byte local_100;
  void *local_f0;
  undefined1 local_e0 [16];
  undefined1 local_d0 [48];
  const_iterator local_a0;
  const_iterator cStack_98;
  vector<int,_std::allocator<int>_> local_90;
  bool local_78;
  undefined7 uStack_77;
  double *local_68;
  
  local_198.m_data = (double *)0x0;
  local_198.m_rows = 0;
  local_198.m_cols = 0;
  local_148 = (DenseStorage<double,__1,__1,_1,_0> *)this;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_198,4,2,2);
  if (local_198.m_rows < 1) {
LAB_001211fb:
    __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                 );
  }
  lVar7 = 0;
  bVar2 = true;
  do {
    bVar5 = bVar2;
    if (local_198.m_cols <= lVar7) goto LAB_001211fb;
    local_198.m_data[lVar7 * local_198.m_rows] = 1.0;
    lVar7 = 1;
    bVar2 = false;
  } while (bVar5);
  Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::vertex_range((Vertex_range *)local_d0,
                 (Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                  *)triangulation);
  local_178.o_it_._M_current =
       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0._0_8_;
  local_178.o_end_._M_current =
       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0._8_8_;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_178.value_,(vector<int,_std::allocator<int>_> *)(local_d0 + 0x10));
  local_178.is_end_ = local_d0[0x28];
  local_128.m_dec =
       (ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_a0._M_current;
  local_128.m_rhs = (Matrix<double,__1,_1,_0,__1,_1> *)cStack_98._M_current;
  std::vector<int,_std::allocator<int>_>::vector(&local_118,&local_90);
  local_100 = local_78;
  if ((local_178.is_end_ & local_78) == 0) {
    lVar7 = 0;
    do {
      std::vector<int,_std::allocator<int>_>::vector(&local_140,&local_178.value_);
      Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
      ::cartesian_coordinates
                ((Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                  *)&local_f0,in_RCX,1.0);
      Function_torus_in_R3::operator()((Function_torus_in_R3 *)local_e0,(VectorXd *)simplex);
      free(local_f0);
      if ((long)local_e0._8_8_ < 1) goto LAB_0012121a;
      if ((local_198.m_rows < 2) || (local_198.m_cols <= lVar7)) goto LAB_001211fb;
      local_198.m_data[local_198.m_rows * lVar7 + 1] = *(double *)local_e0._0_8_;
      free((void *)local_e0._0_8_);
      if (local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_178.is_end_ == false) {
        Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ::update_value(&local_178);
        local_178.o_it_._M_current = local_178.o_it_._M_current + 1;
        if (local_178.o_it_._M_current == local_178.o_end_._M_current) {
          local_178.is_end_ = true;
        }
      }
      lVar7 = lVar7 + 1;
    } while (((local_178.is_end_ & 1U) == 0) || ((local_100 & 1) == 0));
  }
  if (local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_178.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_178.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_178.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((double *)local_d0._16_8_ != (double *)0x0) {
    operator_delete((void *)local_d0._16_8_,local_d0._32_8_ - local_d0._16_8_);
  }
  pDVar3 = (DenseStorage<double,__1,__1,_1,_0> *)malloc(0x10);
  if (((ulong)pDVar3 & 0xf) != 0) {
    __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                  "void *Eigen::internal::aligned_malloc(std::size_t)");
  }
  if (pDVar3 == (DenseStorage<double,__1,__1,_1,_0> *)0x0) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = operator_delete;
    __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_178.o_end_._M_current = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x2;
  pDVar3->m_data = (double *)0x3ff0000000000000;
  pDVar3->m_rows = 0;
  local_178.o_it_._M_current = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)pDVar3;
  Eigen::ColPivHouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_d0,
             (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_198);
  Eigen::SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::
  _check_solve_assertion<false,Eigen::MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>> *)local_d0
             ,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_178);
  pDVar3 = local_148;
  local_148->m_data = (double *)0x0;
  local_148->m_rows = 0;
  local_128.m_dec = (ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_d0;
  local_128.m_rhs = (Matrix<double,__1,_1,_0,__1,_1> *)&local_178;
  if ((long)local_d0._16_8_ < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize(local_148,local_d0._16_8_,local_d0._16_8_,1);
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run((Matrix<double,__1,_1,_0,__1,_1> *)pDVar3,&local_128,(assign_op<double,_double> *)&local_140
       );
  free(local_68);
  free((void *)CONCAT71(uStack_77,local_78));
  free(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish);
  free(cStack_98._M_current);
  free((void *)CONCAT71(local_d0._41_7_,local_d0[0x28]));
  free((void *)local_d0._24_8_);
  free((void *)local_d0._0_8_);
  if (local_198.m_cols != pDVar3->m_rows) {
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                  "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
                 );
  }
  local_d0._8_8_ = pDVar3;
  local_128.m_dec =
       (ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x3d719799812dea11;
  local_d0._0_8_ = &local_198;
  bVar2 = Eigen::internal::
          isApprox_selector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>,_false>
          ::run((Matrix<double,__1,_1,_0,__1,_1> *)&local_178,
                (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                 *)local_d0,(RealScalar *)&local_128);
  if ((!bVar2) && (lVar7 = pDVar3->m_rows, lVar7 != 0)) {
    pdVar1 = pDVar3->m_data;
    lVar6 = 0;
    lVar8 = 0;
    if (0 < lVar7) {
      lVar8 = lVar7;
    }
    do {
      if (lVar8 == lVar6) {
LAB_0012121a:
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      pdVar1[lVar6] = NAN;
      lVar6 = lVar6 + 1;
    } while (lVar7 != lVar6);
  }
  free(local_178.o_it_._M_current);
  free(local_198.m_data);
  VVar9.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar9.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)pDVar3;
  return (VectorXd)VVar9.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Eigen::VectorXd compute_lambda(const Simplex_handle& simplex, const Triangulation& triangulation) const {
    std::size_t cod_d = this->cod_d();
    Eigen::MatrixXd matrix(cod_d + 1, cod_d + 1);
    for (std::size_t i = 0; i < cod_d + 1; ++i) matrix(0, i) = 1;
    std::size_t j = 0;
    for (auto v : simplex.vertex_range()) {
      Eigen::VectorXd v_coords = fun_(triangulation.cartesian_coordinates(v));
      for (std::size_t i = 1; i < cod_d + 1; ++i) matrix(i, j) = v_coords(i - 1);
      j++;
    }
    Eigen::VectorXd z(cod_d + 1);
    z(0) = 1;
    for (std::size_t i = 1; i < cod_d + 1; ++i) z(i) = 0;
    Eigen::VectorXd lambda = matrix.colPivHouseholderQr().solve(z);
    if (!z.isApprox(matrix*lambda)) {
      // NaN non valid results
      for (std::size_t i = 0; i < (std::size_t)lambda.size(); ++i) lambda(i) =
        std::numeric_limits<double>::quiet_NaN();
    }
    return lambda;
  }